

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeMatrB
          (ChElementTetraCorot_10 *this,ChMatrixDynamic<> *mmatrB,double zeta1,double zeta2,
          double zeta3,double zeta4,double *JacobianDet)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Scalar SVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Scalar *pSVar87;
  Scalar SVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  ChMatrixDynamic<> Jacobian;
  Scalar local_30;
  int local_24;
  
  local_24 = 4;
  local_30 = (Scalar)CONCAT44(local_30._4_4_,4);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&Jacobian,(int *)&local_30,&local_24);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[10])
            (zeta1,zeta2,zeta3,zeta4,this,(Matrix<double,_1,_1,1,_1,_1> *)&Jacobian);
  SVar88 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&Jacobian);
  *JacobianDet = SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar3 - dVar4;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = zeta1;
  auVar18 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),ZEXT816(0x4010000000000000),auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 - dVar2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar19 = vfmsub132sd_fma(auVar186,auVar89,auVar19);
  dVar156 = auVar18._0_8_;
  *pSVar87 = (dVar156 * auVar19._0_8_) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,3);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar3 - dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = zeta2;
  auVar18 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),ZEXT816(0x4010000000000000),auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1 - dVar2;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar19 = vfmsub132sd_fma(auVar187,auVar90,auVar21);
  dVar157 = auVar18._0_8_;
  *pSVar87 = (dVar157 * auVar19._0_8_) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,6);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar3 - dVar4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = zeta3;
  auVar18 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),ZEXT816(0x4010000000000000),auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 - dVar2;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar19 = vfmsub132sd_fma(auVar188,auVar91,auVar23);
  dVar158 = auVar18._0_8_;
  *pSVar87 = (dVar158 * auVar19._0_8_) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,9);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = zeta4;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar3 - dVar4;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x4010000000000000),auVar92,ZEXT816(0xbff0000000000000));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 - dVar2;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar19 = vfmsub132sd_fma(auVar189,auVar93,auVar24);
  dVar159 = auVar18._0_8_;
  *pSVar87 = (dVar159 * auVar19._0_8_) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xc)
  ;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar3 - dVar4;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar11 - dVar12;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 - dVar2;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar160,auVar94,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar9 - dVar10;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar190,auVar95,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = zeta1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = auVar19._0_8_ * zeta2;
  auVar18 = vfmadd231sd_fma(auVar96,auVar18,auVar27);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xf)
  ;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar3 - dVar4;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar11 - dVar12;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 - dVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar161,auVar97,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar9 - dVar10;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar191,auVar98,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = zeta2;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = auVar19._0_8_ * zeta3;
  auVar18 = vfmadd231sd_fma(auVar99,auVar18,auVar30);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x12
                      );
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar3 - dVar4;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar11 - dVar12;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 - dVar2;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar162,auVar100,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar9 - dVar10;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar192,auVar101,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = zeta3;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar19._0_8_ * zeta1;
  auVar18 = vfmadd231sd_fma(auVar102,auVar18,auVar33);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x15
                      );
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar3 - dVar4;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar11 - dVar12;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 - dVar2;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar163,auVar103,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar9 - dVar10;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar193,auVar104,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = zeta1;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar105,auVar18,auVar36);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x18
                      );
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar3 - dVar4;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar11 - dVar12;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 - dVar2;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar164,auVar106,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar9 - dVar10;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar194,auVar107,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = zeta2;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar108,auVar18,auVar39);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x1b
                      );
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar3 - dVar4;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar11 - dVar12;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 - dVar2;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar165,auVar109,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar9 - dVar10;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar195,auVar110,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = zeta3;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar111,auVar18,auVar42);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,1);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar3 - dVar4;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1 - dVar2;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar166,auVar112,auVar43);
  *pSVar87 = (auVar18._0_8_ * dVar156) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,4);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar3 - dVar4;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1 - dVar2;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar167,auVar113,auVar44);
  *pSVar87 = (auVar18._0_8_ * dVar157) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,7);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar3 - dVar4;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1 - dVar2;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar168,auVar114,auVar45);
  *pSVar87 = (auVar18._0_8_ * dVar158) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,10);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar3 - dVar4;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 - dVar2;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar169,auVar115,auVar46);
  *pSVar87 = (auVar18._0_8_ * dVar159) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0xd)
  ;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar3 - dVar4;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar11 - dVar12;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar1 - dVar2;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar170,auVar116,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar9 - dVar10;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar196,auVar117,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = zeta1;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar19._0_8_ * zeta2;
  auVar18 = vfmadd231sd_fma(auVar118,auVar18,auVar49);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x10
                      );
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar3 - dVar4;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar11 - dVar12;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1 - dVar2;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar171,auVar119,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar9 - dVar10;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar197,auVar120,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = zeta2;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar19._0_8_ * zeta3;
  auVar18 = vfmadd231sd_fma(auVar121,auVar18,auVar52);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x13
                      );
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar3 - dVar4;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar11 - dVar12;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1 - dVar2;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar172,auVar122,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar9 - dVar10;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar198,auVar123,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = zeta3;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = auVar19._0_8_ * zeta1;
  auVar18 = vfmadd231sd_fma(auVar124,auVar18,auVar55);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x16
                      );
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar3 - dVar4;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar11 - dVar12;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 - dVar2;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar173,auVar125,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar9 - dVar10;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar199,auVar126,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = zeta1;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar127,auVar18,auVar58);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x19
                      );
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar3 - dVar4;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar11 - dVar12;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1 - dVar2;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar174,auVar128,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar9 - dVar10;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar200,auVar129,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = zeta2;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar130,auVar18,auVar61);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,1
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,3,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x1c
                      );
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar3 - dVar4;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar11 - dVar12;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 - dVar2;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar175,auVar131,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar9 - dVar10;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar201,auVar132,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = zeta3;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar133,auVar18,auVar64);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,2);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar3 - dVar4;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1 - dVar2;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar176,auVar134,auVar65);
  *pSVar87 = (auVar18._0_8_ * dVar156) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,5);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar3 - dVar4;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1 - dVar2;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar177,auVar135,auVar66);
  *pSVar87 = (auVar18._0_8_ * dVar157) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,8);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar3 - dVar4;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1 - dVar2;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar178,auVar136,auVar67);
  *pSVar87 = (auVar18._0_8_ * dVar158) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xb)
  ;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = dVar3 - dVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar1 - dVar2;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar179,auVar137,auVar68);
  *pSVar87 = (auVar18._0_8_ * dVar159) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xe)
  ;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar3 - dVar4;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar11 - dVar12;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1 - dVar2;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar180,auVar138,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar9 - dVar10;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar202,auVar139,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = zeta1;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar19._0_8_ * zeta2;
  auVar18 = vfmadd231sd_fma(auVar140,auVar18,auVar71);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x11
                      );
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar3 - dVar4;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar11 - dVar12;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar1 - dVar2;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar181,auVar141,auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar9 - dVar10;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar203,auVar142,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = zeta2;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = auVar19._0_8_ * zeta3;
  auVar18 = vfmadd231sd_fma(auVar143,auVar18,auVar74);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x14
                      );
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar3 - dVar4;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar11 - dVar12;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar1 - dVar2;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar182,auVar144,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar9 - dVar10;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar204,auVar145,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = zeta3;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = auVar19._0_8_ * zeta1;
  auVar18 = vfmadd231sd_fma(auVar146,auVar18,auVar77);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x17
                      );
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar3 - dVar4;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar11 - dVar12;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar1 - dVar2;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar183,auVar147,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar9 - dVar10;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar205,auVar148,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = zeta1;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar149,auVar18,auVar80);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1a
                      );
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar3 - dVar4;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar11 - dVar12;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1 - dVar2;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar184,auVar150,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar9 - dVar10;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar206,auVar151,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = zeta2;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar152,auVar18,auVar83);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar1 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,2
                      );
  dVar2 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar3 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar4 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar5 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar6 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,2
                      );
  dVar7 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar8 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,1
                      );
  dVar9 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar10 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,0
                      );
  dVar11 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar12 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,0
                      );
  dVar13 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,1,3
                      );
  dVar14 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,1
                      );
  dVar15 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&Jacobian,2,3
                      );
  dVar16 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1d
                      );
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar3 - dVar4;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar11 - dVar12;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1 - dVar2;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = (dVar7 - dVar8) * (dVar5 - dVar6);
  auVar18 = vfmsub132sd_fma(auVar185,auVar153,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar9 - dVar10;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = (dVar15 - dVar16) * (dVar13 - dVar14);
  auVar19 = vfmsub132sd_fma(auVar207,auVar154,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = zeta3;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = auVar19._0_8_ * zeta4;
  auVar18 = vfmadd231sd_fma(auVar155,auVar18,auVar86);
  *pSVar87 = (auVar18._0_8_ * 4.0) / SVar88;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,1);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,1);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,4);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,3);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,3);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,4);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,7);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,6);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,6);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,7);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,10);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,9);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,9);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,10);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0xd)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0xc)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xc)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0xd)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x10
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0xf)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xf)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x10
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x13
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x12
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x12
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x13
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x16
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x15
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x15
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x16
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x19
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x18
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x18
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x19
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x1c
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x1b
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x1b
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,3,0x1c
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,2);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,1);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,1);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,2);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,5);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,4);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,4);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,5);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,8);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,7);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,7);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,8);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xb)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,10);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,10);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0xb)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xe)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0xd)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0xd)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0xe)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x11
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x10
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x10
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x11
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x14
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x13
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x13
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x14
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x17
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x16
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x16
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x17
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1a
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x19
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x19
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x1a
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1d
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x1c
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,1,0x1c
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,4,0x1d
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,2);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,2);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,5);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,3);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,3);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,5);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,8);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,6);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,6);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,8);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xb)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,9);
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,9);
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0xb)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0xe)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0xc)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xc)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0xe)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x11
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0xf)
  ;
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0xf)
  ;
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x11
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x14
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x12
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x12
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x14
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x17
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x15
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x15
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x17
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1a
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x18
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x18
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x1a
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,2,0x1d
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x1b
                      );
  *pSVar87 = SVar17;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,0,0x1b
                      );
  SVar17 = *pSVar87;
  pSVar87 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)mmatrB,5,0x1d
                      );
  *pSVar87 = SVar17;
  local_30 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)mmatrB,&local_30);
  Eigen::internal::handmade_aligned_free
            (Jacobian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementTetraCorot_10::ComputeMatrB(ChMatrixDynamic<>& mmatrB,
                                          double zeta1,
                                          double zeta2,
                                          double zeta3,
                                          double zeta4,
                                          double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(4, 4);
    ComputeJacobian(Jacobian, zeta1, zeta2, zeta3, zeta4);

    double Jdet = Jacobian.determinant();
    JacobianDet = Jdet;  // !!! store the Jacobian Determinant: needed for the integration

    mmatrB(0, 0) = (4 * zeta1 - 1) *
                   ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                    (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(0, 3) = (4 * zeta2 - 1) *
                   ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                    (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) /
                   Jdet;
    mmatrB(0, 6) = (4 * zeta3 - 1) *
                   ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                    (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(0, 9) = (4 * zeta4 - 1) *
                   ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                    (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) /
                   Jdet;
    mmatrB(0, 12) = 4 *
                    (zeta1 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) +
                     zeta2 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 15) = 4 *
                    (zeta2 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 18) = 4 *
                    (zeta3 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(0, 21) = 4 *
                    (zeta1 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 24) = 4 *
                    (zeta2 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 27) = 4 *
                    (zeta3 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(1, 1) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                    (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(1, 4) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                    (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 7) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                    (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 10) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                     (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) /
                    Jdet;
    mmatrB(1, 13) = 4 *
                    (zeta1 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) +
                     zeta2 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 16) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 19) = 4 *
                    (zeta3 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 22) = 4 *
                    (zeta1 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 25) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 28) = 4 *
                    (zeta3 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(2, 2) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                    (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) /
                   Jdet;
    mmatrB(2, 5) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                    (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) /
                   Jdet;
    mmatrB(2, 8) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                    (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) /
                   Jdet;
    mmatrB(2, 11) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                     (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) /
                    Jdet;
    mmatrB(2, 14) = 4 *
                    (zeta1 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) +
                     zeta2 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 17) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) +
                     zeta3 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 20) = 4 *
                    (zeta3 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) +
                     zeta1 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;
    mmatrB(2, 23) = 4 *
                    (zeta1 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 26) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 29) = 4 *
                    (zeta3 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;

    mmatrB(3, 0) = mmatrB(1, 1);
    mmatrB(3, 1) = mmatrB(0, 0);
    mmatrB(3, 3) = mmatrB(1, 4);
    mmatrB(3, 4) = mmatrB(0, 3);
    mmatrB(3, 6) = mmatrB(1, 7);
    mmatrB(3, 7) = mmatrB(0, 6);
    mmatrB(3, 9) = mmatrB(1, 10);
    mmatrB(3, 10) = mmatrB(0, 9);
    mmatrB(3, 12) = mmatrB(1, 13);
    mmatrB(3, 13) = mmatrB(0, 12);
    mmatrB(3, 15) = mmatrB(1, 16);
    mmatrB(3, 16) = mmatrB(0, 15);
    mmatrB(3, 18) = mmatrB(1, 19);
    mmatrB(3, 19) = mmatrB(0, 18);
    mmatrB(3, 21) = mmatrB(1, 22);
    mmatrB(3, 22) = mmatrB(0, 21);
    mmatrB(3, 24) = mmatrB(1, 25);
    mmatrB(3, 25) = mmatrB(0, 24);
    mmatrB(3, 27) = mmatrB(1, 28);
    mmatrB(3, 28) = mmatrB(0, 27);

    mmatrB(4, 1) = mmatrB(2, 2);
    mmatrB(4, 2) = mmatrB(1, 1);
    mmatrB(4, 4) = mmatrB(2, 5);
    mmatrB(4, 5) = mmatrB(1, 4);
    mmatrB(4, 7) = mmatrB(2, 8);
    mmatrB(4, 8) = mmatrB(1, 7);
    mmatrB(4, 10) = mmatrB(2, 11);
    mmatrB(4, 11) = mmatrB(1, 10);
    mmatrB(4, 13) = mmatrB(2, 14);
    mmatrB(4, 14) = mmatrB(1, 13);
    mmatrB(4, 16) = mmatrB(2, 17);
    mmatrB(4, 17) = mmatrB(1, 16);
    mmatrB(4, 19) = mmatrB(2, 20);
    mmatrB(4, 20) = mmatrB(1, 19);
    mmatrB(4, 22) = mmatrB(2, 23);
    mmatrB(4, 23) = mmatrB(1, 22);
    mmatrB(4, 25) = mmatrB(2, 26);
    mmatrB(4, 26) = mmatrB(1, 25);
    mmatrB(4, 28) = mmatrB(2, 29);
    mmatrB(4, 29) = mmatrB(1, 28);

    mmatrB(5, 0) = mmatrB(2, 2);
    mmatrB(5, 2) = mmatrB(0, 0);
    mmatrB(5, 3) = mmatrB(2, 5);
    mmatrB(5, 5) = mmatrB(0, 3);
    mmatrB(5, 6) = mmatrB(2, 8);
    mmatrB(5, 8) = mmatrB(0, 6);
    mmatrB(5, 9) = mmatrB(2, 11);
    mmatrB(5, 11) = mmatrB(0, 9);
    mmatrB(5, 12) = mmatrB(2, 14);
    mmatrB(5, 14) = mmatrB(0, 12);
    mmatrB(5, 15) = mmatrB(2, 17);
    mmatrB(5, 17) = mmatrB(0, 15);
    mmatrB(5, 18) = mmatrB(2, 20);
    mmatrB(5, 20) = mmatrB(0, 18);
    mmatrB(5, 21) = mmatrB(2, 23);
    mmatrB(5, 23) = mmatrB(0, 21);
    mmatrB(5, 24) = mmatrB(2, 26);
    mmatrB(5, 26) = mmatrB(0, 24);
    mmatrB(5, 27) = mmatrB(2, 29);
    mmatrB(5, 29) = mmatrB(0, 27);

    mmatrB *= 2;
}